

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int open_get_desired_capabilities(OPEN_HANDLE open,AMQP_VALUE *desired_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *desired_capabilities_single_value;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar3 = 0x7b7;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,&item_count);
    iVar3 = 0x7bf;
    if ((iVar1 == 0) && (iVar3 = 0x7c5, 8 < item_count)) {
      pAVar4 = amqpvalue_get_composite_item_in_place(open->composite_value,8);
      iVar3 = 0x7cd;
      if ((pAVar4 != (AMQP_VALUE)0x0) &&
         (AVar2 = amqpvalue_get_type(pAVar4), AVar2 != AMQP_TYPE_NULL)) {
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          desired_capabilities_single_value = (char *)0x0;
          bVar5 = true;
        }
        else {
          iVar3 = amqpvalue_get_symbol(pAVar4,&desired_capabilities_single_value);
          bVar5 = iVar3 != 0;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          iVar3 = amqpvalue_get_array(pAVar4,desired_capabilities_value);
          if ((bool)(iVar3 != 0 & bVar5)) {
            return 0x7e0;
          }
        }
        else if (bVar5) {
          return 0x7e0;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        iVar3 = 0;
        if (AVar2 != AMQP_TYPE_ARRAY) {
          pAVar4 = amqpvalue_create_array();
          *desired_capabilities_value = pAVar4;
          if (pAVar4 == (AMQP_VALUE)0x0) {
            iVar3 = 0x7e9;
          }
          else {
            pAVar4 = amqpvalue_create_symbol(desired_capabilities_single_value);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              iVar3 = 0x7f0;
            }
            else {
              iVar1 = amqpvalue_add_array_item(*desired_capabilities_value,pAVar4);
              iVar3 = 0x7f6;
              if (iVar1 == 0) {
                iVar1 = amqpvalue_set_composite_item
                                  (open->composite_value,8,*desired_capabilities_value);
                iVar3 = 0x7fc;
                if (iVar1 == 0) {
                  iVar3 = 0;
                }
              }
              amqpvalue_destroy(pAVar4);
            }
            amqpvalue_destroy(*desired_capabilities_value);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int open_get_desired_capabilities(OPEN_HANDLE open, AMQP_VALUE* desired_capabilities_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 8)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 8);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* desired_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &desired_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&desired_capabilities_single_value, 0, sizeof(desired_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, desired_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *desired_capabilities_value = amqpvalue_create_array();
                            if (*desired_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(desired_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*desired_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(open_instance->composite_value, 8, *desired_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*desired_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}